

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O1

void af_glyph_hints_align_strong_points(AF_GlyphHints hints,AF_Dimension dim)

{
  short sVar1;
  int iVar2;
  AF_Edge_conflict pAVar3;
  AF_Edge_conflict pAVar4;
  long lVar5;
  FT_Long FVar6;
  long lVar7;
  AF_Edge_conflict pAVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  AF_Point_conflict point;
  AF_Point_conflict pAVar12;
  AF_Point_conflict pAVar13;
  bool bVar14;
  
  iVar2 = hints->axis[dim].num_edges;
  lVar11 = (long)iVar2;
  if (0 < hints->num_points && 0 < lVar11) {
    pAVar12 = hints->points;
    pAVar13 = pAVar12 + hints->num_points;
    pAVar3 = hints->axis[dim].edges;
    bVar14 = dim != AF_DIMENSION_HORZ;
    do {
      if (((ushort)bVar14 * 4 + 0x14 & pAVar12->flags) == 0) {
        sVar1 = (&pAVar12->fx)[dim == AF_DIMENSION_VERT];
        pAVar8 = pAVar3;
        pAVar4 = pAVar3;
        if ((pAVar3->fpos < sVar1) &&
           (pAVar8 = pAVar3 + lVar11 + -1, pAVar4 = pAVar3 + lVar11 + -1,
           sVar1 < pAVar3[lVar11 + -1].fpos)) {
          if (iVar2 < 9) {
            lVar5 = 0;
            pAVar8 = pAVar3;
            do {
              lVar7 = lVar5;
              if (sVar1 <= pAVar8->fpos) break;
              lVar5 = lVar5 + 1;
              pAVar8 = pAVar8 + 1;
              lVar7 = lVar11;
            } while (lVar11 != lVar5);
            if (pAVar3[lVar7].fpos != sVar1) goto LAB_00183f6e;
            lVar7 = pAVar3[lVar7].pos;
            iVar9 = 5;
          }
          else {
            lVar7 = 0;
            lVar5 = lVar11;
            do {
              lVar10 = lVar5 + lVar7 >> 1;
              if (pAVar3[lVar10].fpos <= sVar1) {
                if (sVar1 <= pAVar3[lVar10].fpos) {
                  lVar7 = pAVar3[lVar10].pos;
                  iVar9 = 5;
                  goto LAB_00184001;
                }
                lVar7 = lVar10 + 1;
                lVar10 = lVar5;
              }
              lVar5 = lVar10;
            } while (lVar7 < lVar10);
LAB_00183f6e:
            pAVar8 = pAVar3 + lVar7;
            if (pAVar3[lVar7 + -1].scale == 0) {
              FVar6 = FT_DivFix(pAVar8->pos - pAVar8[-1].pos,
                                (long)pAVar8->fpos - (long)pAVar8[-1].fpos);
              pAVar8[-1].scale = FVar6;
            }
            lVar7 = (long)(int)pAVar8[-1].scale * ((long)sVar1 - (long)pAVar8[-1].fpos);
            lVar7 = ((lVar7 >> 0x3f) + lVar7 + 0x8000 >> 0x10) + pAVar8[-1].pos;
            iVar9 = 0;
          }
LAB_00184001:
          if ((iVar9 != 0) && (iVar9 != 5)) goto LAB_00183f27;
        }
        else {
          lVar7 = ((&pAVar12->ox)[dim == AF_DIMENSION_VERT] + pAVar8->pos) - pAVar4->opos;
        }
        (&pAVar12->x)[bVar14] = lVar7;
        pAVar12->flags = pAVar12->flags | (ushort)bVar14 * 4 + 4;
      }
LAB_00183f27:
      pAVar12 = pAVar12 + 1;
    } while (pAVar12 < pAVar13);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_strong_points( AF_GlyphHints  hints,
                                      AF_Dimension   dim )
  {
    AF_Point      points      = hints->points;
    AF_Point      point_limit = points + hints->num_points;
    AF_AxisHints  axis        = &hints->axis[dim];
    AF_Edge       edges       = axis->edges;
    AF_Edge       edge_limit  = edges + axis->num_edges;
    FT_UInt       touch_flag;


    if ( dim == AF_DIMENSION_HORZ )
      touch_flag = AF_FLAG_TOUCH_X;
    else
      touch_flag  = AF_FLAG_TOUCH_Y;

    if ( edges < edge_limit )
    {
      AF_Point  point;
      AF_Edge   edge;


      for ( point = points; point < point_limit; point++ )
      {
        FT_Pos  u, ou, fu;  /* point position */
        FT_Pos  delta;


        if ( point->flags & touch_flag )
          continue;

        /* if this point is candidate to weak interpolation, we       */
        /* interpolate it after all strong points have been processed */

        if ( ( point->flags & AF_FLAG_WEAK_INTERPOLATION ) )
          continue;

        if ( dim == AF_DIMENSION_VERT )
        {
          u  = point->fy;
          ou = point->oy;
        }
        else
        {
          u  = point->fx;
          ou = point->ox;
        }

        fu = u;

        /* is the point before the first edge? */
        edge  = edges;
        delta = edge->fpos - u;
        if ( delta >= 0 )
        {
          u = edge->pos - ( edge->opos - ou );
          goto Store_Point;
        }

        /* is the point after the last edge? */
        edge  = edge_limit - 1;
        delta = u - edge->fpos;
        if ( delta >= 0 )
        {
          u = edge->pos + ( ou - edge->opos );
          goto Store_Point;
        }

        {
          FT_PtrDist  min, max, mid;
          FT_Pos      fpos;


          /* find enclosing edges */
          min = 0;
          max = edge_limit - edges;

#if 1
          /* for a small number of edges, a linear search is better */
          if ( max <= 8 )
          {
            FT_PtrDist  nn;


            for ( nn = 0; nn < max; nn++ )
              if ( edges[nn].fpos >= u )
                break;

            if ( edges[nn].fpos == u )
            {
              u = edges[nn].pos;
              goto Store_Point;
            }
            min = nn;
          }
          else
#endif
          while ( min < max )
          {
            mid  = ( max + min ) >> 1;
            edge = edges + mid;
            fpos = edge->fpos;

            if ( u < fpos )
              max = mid;
            else if ( u > fpos )
              min = mid + 1;
            else
            {
              /* we are on the edge */
              u = edge->pos;
              goto Store_Point;
            }
          }

          /* point is not on an edge */
          {
            AF_Edge  before = edges + min - 1;
            AF_Edge  after  = edges + min + 0;


            /* assert( before && after && before != after ) */
            if ( before->scale == 0 )
              before->scale = FT_DivFix( after->pos - before->pos,
                                         after->fpos - before->fpos );

            u = before->pos + FT_MulFix( fu - before->fpos,
                                         before->scale );
          }
        }

      Store_Point:
        /* save the point position */
        if ( dim == AF_DIMENSION_HORZ )
          point->x = u;
        else
          point->y = u;

        point->flags |= touch_flag;
      }
    }
  }